

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O2

error assemble_float_immediate(context *ctx,token *token,opcode *op,int bits)

{
  uint32_t uVar1;
  long lVar2;
  int iVar3;
  undefined4 in_register_0000000c;
  uint64_t bits_00;
  int in_R8D;
  float fVar4;
  token local_58;
  
  uVar1 = op[1].reuse;
  switch(uVar1) {
  case 1:
  case 6:
  case 7:
    if (uVar1 != 1) {
      context::tokenize(&local_58,(context *)token);
      *(int *)&op[2].value = local_58.column;
      op[1].value = (uint64_t)local_58.data.string._M_str;
      op[1].reuse = local_58.type;
      op[1].sched = (anon_union_4_2_f99a8bb9_for_sched)local_58.line;
      op->value = (uint64_t)local_58.filename;
      op->reuse = local_58.data.predicate.index;
      op->sched = (anon_union_4_2_f99a8bb9_for_sched)local_58.data.predicate.negated;
    }
    iVar3 = equal((token *)op,"QNAN");
    if (iVar3 == 0) {
      iVar3 = equal((token *)op,"INF");
      if (iVar3 == 0) goto switchD_0012a00c_caseD_2;
      fVar4 = INFINITY;
    }
    else {
      fVar4 = NAN;
    }
    if (uVar1 == 7) {
      fVar4 = -fVar4;
    }
    break;
  default:
switchD_0012a00c_caseD_2:
    fail((token *)ctx,(char *)op,"expected floating-point literal, QNAN, or INF");
    return (unique_ptr<char[],_std::default_delete<char[]>_>)
           (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
  case 4:
    lVar2._0_4_ = op->reuse;
    lVar2._4_4_ = op->sched;
    fVar4 = (float)lVar2;
    break;
  case 5:
    fVar4 = (float)*(double *)&op->reuse;
  }
  if (in_R8D == 0x20) {
    bits_00 = (ulong)(uint)fVar4 << 0x14;
  }
  else {
    if (in_R8D != 0x14) {
      __assert_fail("false && \"invalid bits\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ReinUsesLisp[P]nxas/src/helper.cpp"
                    ,0xc4,"error assemble_float_immediate(context &, token &, opcode &, int)");
    }
    opcode::add_bits((opcode *)CONCAT44(in_register_0000000c,bits),
                     (ulong)((uint)fVar4 >> 0xc & 0x7ffff) << 0x14);
    if (-1 < (int)fVar4) goto LAB_0012a0fe;
    bits_00 = 0x100000000000000;
  }
  opcode::add_bits((opcode *)CONCAT44(in_register_0000000c,bits),bits_00);
LAB_0012a0fe:
  context::tokenize(&local_58,(context *)token);
  *(int *)&op[2].value = local_58.column;
  op[1].value = (uint64_t)local_58.data.string._M_str;
  op[1].reuse = local_58.type;
  op[1].sched = (anon_union_4_2_f99a8bb9_for_sched)local_58.line;
  op->value = (uint64_t)local_58.filename;
  op->reuse = local_58.data.predicate.index;
  op->sched = (anon_union_4_2_f99a8bb9_for_sched)local_58.data.predicate.negated;
  ctx->pc = 0;
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
}

Assistant:

error assemble_float_immediate(context& ctx, token& token, opcode& op, int bits)
{
    static constexpr char MESSAGE[] = "expected floating-point literal, QNAN, or INF";

    float value;
    switch (token.type) {
    case token_type::float_immediate:
        value = token.data.float_immediate;
        break;
    case token_type::immediate:
        value = static_cast<float>(token.data.immediate);
        if (static_cast<int64_t>(token.data.immediate) != value) {
            return fail(token, "integer immediate " PRId64 "cannot be represented as float",
                        token.data.immediate);
        }
        break;
    case token_type::plus:
    case token_type::minus:
    case token_type::identifier: {
        const bool negate = token.type == token_type::minus;
        if (token.type != token_type::identifier) {
            token = ctx.tokenize();
        }
        if (equal(token, "QNAN")) {
            value = std::numeric_limits<float>::quiet_NaN();
        } else if (equal(token, "INF")) {
            value = std::numeric_limits<float>::infinity();
        } else {
            return fail(token, MESSAGE);
        }
        if (negate) {
            value = -value;
        }
        break;
    }
    default:
        return fail(token, MESSAGE);
    }
    uint32_t raw;
    std::memcpy(&raw, &value, sizeof(raw));
    if (bits == 20) {
        // TODO: add a setting to warn/error precision losses
        // if ((raw >> 12) << 12 != raw) ...
        op.add_bits(static_cast<uint64_t>((raw << 1) >> 13) << 20);
        if (raw >> 31 != 0) {
            op.add_bits(1ULL << 56);
        }
    } else if (bits == 32) {
        op.add_bits(static_cast<uint64_t>(raw) << 20);
    } else {
        assert(false && "invalid bits");
    }
    token = ctx.tokenize();
    return {};
}